

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O1

int __thiscall
ezc3d::c3d::readInt(c3d *this,PROCESSOR_TYPE processorType,fstream *file,uint nByteToRead,
                   int nByteFromPrevious,seekdir *pos)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  c3d *this_00;
  vector<char,_std::allocator<char>_> *c;
  
  this_00 = this;
  if (this->m_nByteToReadMax_int < nByteToRead) {
    resizeCharHolder(this,nByteToRead);
  }
  c = &this->c_int;
  readFile(this_00,file,nByteToRead,c,nByteFromPrevious,pos);
  if (processorType == MIPS) {
    if (nByteToRead != 0) {
      uVar2 = (ulong)(nByteToRead - 1);
      uVar3 = 0;
      do {
        this_00 = (c3d *)(this->c_int_tp).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        *(char *)((long)&(this_00->_filePath)._M_dataplus._M_p + uVar3) =
             (this->c_int).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 - 1;
      } while (nByteToRead != uVar3);
    }
    c = &this->c_int_tp;
    (this->c_int_tp).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start[nByteToRead] = '\0';
  }
  iVar1 = hex2int(this_00,c,nByteToRead);
  return iVar1;
}

Assistant:

int ezc3d::c3d::readInt(PROCESSOR_TYPE processorType, std::fstream &file,
                        unsigned int nByteToRead, int nByteFromPrevious,
                        const std::ios_base::seekdir &pos) {
  if (nByteToRead > m_nByteToReadMax_int)
    resizeCharHolder(nByteToRead);

  readFile(file, nByteToRead, c_int, nByteFromPrevious, pos);

  int out;
  if (processorType == PROCESSOR_TYPE::MIPS) {
    // This is more or less good. Sometimes, it should not reverse...
    for (size_t i = 0; i < nByteToRead; ++i) {
      c_int_tp[i] = c_int[nByteToRead - 1 - i];
    }
    c_int_tp[nByteToRead] = '\0';
    out = hex2int(c_int_tp, nByteToRead);
  } else {
    // make sure it is an int and not an unsigned int
    out = hex2int(c_int, nByteToRead);
  }

  return out;
}